

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_as_strings.h
# Opt level: O2

string * join_as_strings<ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>>,____C_A_T_C_H____T_E_S_T____141()::__0>&>
                   (string *__return_storage_ptr__,
                   drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>
                   *range,string_view separator)

{
  pointer piVar1;
  int *piVar2;
  int *piVar3;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>_>,_const_ezy::to_string_fn_&>
  local_b8;
  string *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  result_type local_90;
  reference_wrapper<const_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  to_string_fn *local_58;
  const_iterator local_50;
  
  local_b8.transformation = (to_string_fn *)&ezy::cpo::to_string;
  local_b8.orig_range.t = range;
  ezy::detail::
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/algorithm.cc:764:41)>_>,_const_ezy::to_string_fn_&>
  ::begin((const_iterator *)&local_90,&local_b8);
  if ((pointer)local_90._M_string_length ==
      (((range->range).t)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ezy::detail::
    range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/algorithm.cc:764:41)>_>,_const_ezy::to_string_fn_&>
    ::begin((const_iterator *)&local_90,&local_b8);
    ezy::detail::
    iterator_adaptor<ezy::detail::drop_while_iterator<std::vector<int,std::allocator<int>>const,____C_A_T_C_H____T_E_S_T____141()::$_0>,ezy::to_string_fn_const&>
    ::operator*[abi_cxx11_(__return_storage_ptr__,&local_90);
    ezy::detail::
    range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::drop_while_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_std::vector<int,_std::allocator<int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/tests/algorithm.cc:764:41)>_>,_const_ezy::to_string_fn_&>
    ::begin(&local_50,&local_b8);
    local_70._M_data =
         (vector<int,_std::allocator<int>_> *)
         local_50.
         super_basic_iterator_adaptor<ezy::detail::drop_while_iterator<const_std::vector<int,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>_>
         .orig.tracker.ranges.
         super__Tuple_impl<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>_>
         .
         super__Head_base<0UL,_std::reference_wrapper<const_std::vector<int,_std::allocator<int>_>_>,_false>
         ._M_head_impl._M_data;
    local_58 = local_50.converter;
    piVar1 = (((range->range).t)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (int *)((long)local_50.
                           super_basic_iterator_adaptor<ezy::detail::drop_while_iterator<const_std::vector<int,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>_>
                           .orig.tracker.current.
                           super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           .
                           super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                           ._M_head_impl._M_current + 8);
    local_a8 = __return_storage_ptr__;
    local_a0._M_len = separator._M_len;
    local_a0._M_str = separator._M_str;
    local_68 = (int *)((long)local_50.
                             super_basic_iterator_adaptor<ezy::detail::drop_while_iterator<const_std::vector<int,_std::allocator<int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_algorithm_cc:764:41)>_>
                             .orig.tracker.current.
                             super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                             .
                             super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                             ._M_head_impl._M_current + 4);
    while (piVar3 = piVar2, piVar3 + -1 != piVar1) {
      ezy::detail::
      iterator_adaptor<ezy::detail::drop_while_iterator<std::vector<int,std::allocator<int>>const,____C_A_T_C_H____T_E_S_T____141()::$_0>,ezy::to_string_fn_const&>
      ::operator*[abi_cxx11_(&local_90,&local_70);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)local_a8,&local_a0);
      std::__cxx11::string::append((string *)local_a8);
      std::__cxx11::string::~string((string *)&local_90);
      local_68 = piVar3;
      piVar2 = piVar3 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
join_as_strings(Range&& range, std::string_view separator = "")
{
  return ezy::join(ezy::transform(std::forward<Range>(range), ezy::to_string), separator);
}